

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_by_2_internal.c
# Opt level: O0

void WebRtcSpl_DownBy2ShortToInt(int16_t *in,int32_t len,int32_t *out,int32_t *state)

{
  int iVar1;
  int iVar2;
  int local_38;
  int local_34;
  int32_t i;
  int32_t diff;
  int32_t tmp1;
  int32_t tmp0;
  int32_t *state_local;
  int32_t *out_local;
  int32_t len_local;
  int16_t *in_local;
  
  for (local_38 = 0; local_38 < len >> 1; local_38 = local_38 + 1) {
    iVar1 = in[local_38 << 1] * 0x8000 + 0x4000;
    iVar2 = *state + ((iVar1 - state[1]) + 0x2000 >> 0xe) * 0xbea;
    *state = iVar1;
    local_34 = iVar2 - state[2] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    iVar1 = state[1] + local_34 * 0x2498;
    state[1] = iVar2;
    local_34 = iVar1 - state[3] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    state[3] = state[2] + local_34 * 0x3ad7;
    state[2] = iVar1;
    out[local_38] = state[3] >> 1;
  }
  for (local_38 = 0; local_38 < len >> 1; local_38 = local_38 + 1) {
    iVar1 = in[(long)(local_38 << 1) + 1] * 0x8000 + 0x4000;
    iVar2 = state[4] + ((iVar1 - state[5]) + 0x2000 >> 0xe) * 0x335;
    state[4] = iVar1;
    local_34 = iVar2 - state[6] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    iVar1 = state[5] + local_34 * 0x17de;
    state[5] = iVar2;
    local_34 = iVar1 - state[7] >> 0xe;
    if (local_34 < 0) {
      local_34 = local_34 + 1;
    }
    state[7] = state[6] + local_34 * 0x305e;
    state[6] = iVar1;
    out[local_38] = (state[7] >> 1) + out[local_38];
  }
  return;
}

Assistant:

void WebRtcSpl_DownBy2ShortToInt(const int16_t *in,
                                  int32_t len,
                                  int32_t *out,
                                  int32_t *state)
{
    int32_t tmp0, tmp1, diff;
    int32_t i;

    len >>= 1;

    // lower allpass filter (operates on even input samples)
    for (i = 0; i < len; i++)
    {
        tmp0 = ((int32_t)in[i << 1] << 15) + (1 << 14);
        diff = tmp0 - state[1];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[0] + diff * kResampleAllpass[1][0];
        state[0] = tmp0;
        diff = tmp1 - state[2];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[1] + diff * kResampleAllpass[1][1];
        state[1] = tmp1;
        diff = tmp0 - state[3];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[3] = state[2] + diff * kResampleAllpass[1][2];
        state[2] = tmp0;

        // divide by two and store temporarily
        out[i] = (state[3] >> 1);
    }

    in++;

    // upper allpass filter (operates on odd input samples)
    for (i = 0; i < len; i++)
    {
        tmp0 = ((int32_t)in[i << 1] << 15) + (1 << 14);
        diff = tmp0 - state[5];
        // scale down and round
        diff = (diff + (1 << 13)) >> 14;
        tmp1 = state[4] + diff * kResampleAllpass[0][0];
        state[4] = tmp0;
        diff = tmp1 - state[6];
        // scale down and round
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        tmp0 = state[5] + diff * kResampleAllpass[0][1];
        state[5] = tmp1;
        diff = tmp0 - state[7];
        // scale down and truncate
        diff = diff >> 14;
        if (diff < 0)
            diff += 1;
        state[7] = state[6] + diff * kResampleAllpass[0][2];
        state[6] = tmp0;

        // divide by two and store temporarily
        out[i] += (state[7] >> 1);
    }

    in--;
}